

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O3

void __thiscall PathMatcher<int>::~PathMatcher(PathMatcher<int> *this)

{
  ~PathMatcher(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~PathMatcher() {
        for(size_t i = 0; i < paths_.size(); i++) {
            delete paths_[i];
        }
    }